

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O3

bool __thiscall
QDateTimeParser::skipToNextSection
          (QDateTimeParser *this,int index,QDateTime *current,QStringView text)

{
  long lVar1;
  bool bVar2;
  weak_ordering wVar3;
  TimeSpec TVar4;
  int iVar5;
  uint uVar6;
  SectionNode *pSVar7;
  uint insert;
  long in_FS_OFFSET;
  int local_70;
  int local_6c;
  QDateTime tmp;
  QDateTime minimum;
  QDateTime maximum;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar7 = sectionNode(this,index);
  local_70 = absoluteMin(this,index);
  local_6c = absoluteMax(this,index,current);
  if (pSVar7->type == TimeZoneSection) {
    TVar4 = QDateTime::timeSpec(current);
    if (TVar4 != OffsetFromUTC) goto LAB_0040b581;
  }
  maximum.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
  QDateTime::timeRepresentation(&minimum);
  (*this->_vptr_QDateTimeParser[4])(&maximum,this,&minimum);
  QTimeZone::~QTimeZone((QTimeZone *)&minimum);
  minimum.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
  QDateTime::timeRepresentation(&tmp);
  (*this->_vptr_QDateTimeParser[3])(&minimum,this,&tmp);
  QTimeZone::~QTimeZone((QTimeZone *)&tmp);
  tmp.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
  QDateTime::QDateTime(&tmp,current);
  bVar2 = setDigit(this,&tmp,index,local_70);
  if (bVar2) {
    wVar3 = compareThreeWay(&tmp,&minimum);
    if (wVar3.m_order < '\0') goto LAB_0040b513;
  }
  else {
LAB_0040b513:
    local_70 = getDigit(this,&minimum,index);
  }
  bVar2 = setDigit(this,&tmp,index,local_6c);
  if (bVar2) {
    wVar3 = compareThreeWay(&tmp,&maximum);
    if ('\0' < wVar3.m_order) goto LAB_0040b550;
  }
  else {
LAB_0040b550:
    local_6c = getDigit(this,&maximum,index);
  }
  QDateTime::~QDateTime(&tmp);
  QDateTime::~QDateTime(&minimum);
  QDateTime::~QDateTime(&maximum);
LAB_0040b581:
  iVar5 = (*this->_vptr_QDateTimeParser[5])(this);
  uVar6 = iVar5 - pSVar7->pos;
  insert = 0xffffffff;
  if ((long)(ulong)uVar6 < text.m_size) {
    insert = uVar6;
  }
  if ((int)uVar6 < 0) {
    insert = 0xffffffff;
  }
  bVar2 = potentialValue(this,text,local_70,local_6c,index,current,insert);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return !bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QDateTimeParser::skipToNextSection(int index, const QDateTime &current, QStringView text) const
{
    Q_ASSERT(text.size() < sectionMaxSize(index));
    const SectionNode &node = sectionNode(index);
    int min = absoluteMin(index);
    int max = absoluteMax(index, current);
    // Time-zone field is only numeric if given as offset from UTC:
    if (node.type != TimeZoneSection || current.timeSpec() == Qt::OffsetFromUTC) {
        const QDateTime maximum = getMaximum(current.timeRepresentation());
        const QDateTime minimum = getMinimum(current.timeRepresentation());
        // Range from minimum to maximum might not contain current if an earlier
        // field's value was full-width but out of range. In such a case the
        // parse is already headed for Invalid, so it doesn't matter that we get
        // the wrong range of values for the current field here.

        QDateTime tmp = current;
        if (!setDigit(tmp, index, min) || tmp < minimum)
            min = getDigit(minimum, index);

        if (!setDigit(tmp, index, max) || tmp > maximum)
            max = getDigit(maximum, index);
    }
    int pos = cursorPosition() - node.pos;
    if (pos < 0 || pos >= text.size())
        pos = -1;

    /*
      If the value potentially can become another valid entry we don't want to
      skip to the next. E.g. In a M field (month without leading 0) if you type
      1 we don't want to autoskip (there might be [012] following) but if you
      type 3 we do.
    */
    return !potentialValue(text, min, max, index, current, pos);
}